

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3BinHash(void *pKey,int nKey)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  
  if (0 < nKey) {
    uVar3 = nKey + 1;
    uVar2 = 0;
    do {
      cVar1 = *pKey;
      pKey = (void *)((long)pKey + 1);
      uVar2 = uVar2 * 8 ^ uVar2 ^ (int)cVar1;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
    return uVar2 & 0x7fffffff;
  }
  return 0;
}

Assistant:

static int fts3BinHash(const void *pKey, int nKey){
  int h = 0;
  const char *z = (const char *)pKey;
  while( nKey-- > 0 ){
    h = (h<<3) ^ h ^ *(z++);
  }
  return h & 0x7fffffff;
}